

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O0

void __thiscall
biosoup::Sequence::Sequence(Sequence *this,string *name,string *data,string *quality)

{
  uint32_t name_len;
  uint32_t data_len;
  uint32_t quality_len;
  char *name_00;
  char *data_00;
  char *quality_00;
  string *quality_local;
  string *data_local;
  string *name_local;
  Sequence *this_local;
  
  name_00 = (char *)std::__cxx11::string::c_str();
  name_len = std::__cxx11::string::size();
  data_00 = (char *)std::__cxx11::string::c_str();
  data_len = std::__cxx11::string::size();
  quality_00 = (char *)std::__cxx11::string::c_str();
  quality_len = std::__cxx11::string::size();
  Sequence(this,name_00,name_len,data_00,data_len,quality_00,quality_len);
  return;
}

Assistant:

Sequence(
      const std::string& name,
      const std::string& data,
      const std::string& quality)
      : Sequence(
          name.c_str(), name.size(),
          data.c_str(), data.size(),
          quality.c_str(), quality.size()) {}